

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gedung.h
# Opt level: O0

void __thiscall KumpulanKubus::print(KumpulanKubus *this,FrameBuffer *fb)

{
  FrameBuffer *fb_local;
  KumpulanKubus *this_local;
  
  Shape::print(&this->stei->super_Shape,fb);
  Shape::print(&this->fmipa->super_Shape,fb);
  Shape::print(&this->fsrd->super_Shape,fb);
  Shape::print(&this->fitb->super_Shape,fb);
  Shape::print(&this->fttm->super_Shape,fb);
  Shape::print(&this->sith->super_Shape,fb);
  Shape::print(&this->sf->super_Shape,fb);
  Shape::print(&this->sbm->super_Shape,fb);
  Shape::print(&this->umum->super_Shape,fb);
  Shape::print(&this->other->super_Shape,fb);
  Shape::print(&this->ftsl->super_Shape,fb);
  Shape::print(&this->sappk->super_Shape,fb);
  Shape::print(&this->ftmd->super_Shape,fb);
  Shape::print(&this->fti->super_Shape,fb);
  return;
}

Assistant:

void print(FrameBuffer& fb){
    stei->print(fb);
    fmipa->print(fb);
    fsrd->print(fb);
    fitb->print(fb);
    fttm->print(fb);
    sith->print(fb);
    sf->print(fb);
    sbm->print(fb);
    umum->print(fb);
    other->print(fb);
    ftsl->print(fb);
    sappk->print(fb);
    ftmd->print(fb);
    fti->print(fb);
  }